

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

void __thiscall leveldb::Block::Iter::Seek(Iter *this,Slice *target)

{
  byte *limit;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte *p;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint index;
  long in_FS_OFFSET;
  bool bVar8;
  Slice mid_key;
  uint32_t value_length;
  uint32_t non_shared;
  uint32_t shared;
  byte *local_58;
  ulong local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = this->num_restarts_ - 1;
  index = 0;
  do {
    if (uVar7 <= index) {
      SeekToRestartPoint(this,index);
      goto LAB_00d51e34;
    }
    uVar6 = index + uVar7 + 1 >> 1;
    if (this->num_restarts_ <= uVar6) {
      __assert_fail("index < num_restarts_",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/block.cc"
                    ,0x65,"uint32_t leveldb::Block::Iter::GetRestartPoint(uint32_t)");
    }
    uVar3 = this->restarts_;
    limit = (byte *)(this->data_ + uVar3);
    uVar2 = *(uint *)(limit + (ulong)uVar6 * 4);
    if ((long)((ulong)uVar3 - (ulong)uVar2) < 3) {
LAB_00d51dcc:
      pbVar5 = (byte *)0x0;
    }
    else {
      pbVar5 = (byte *)(this->data_ + uVar2);
      local_3c = (uint)*pbVar5;
      local_40 = (uint)pbVar5[1];
      local_44 = (uint)pbVar5[2];
      if ((byte)(pbVar5[1] | *pbVar5 | pbVar5[2]) < 0x80) {
        pbVar5 = pbVar5 + 3;
      }
      else {
        if (uVar2 < uVar3) {
          uVar3 = (uint)(char)*pbVar5;
          p = (byte *)(ulong)uVar3;
          if ((int)uVar3 < 0) goto LAB_00d51d59;
          pbVar5 = pbVar5 + 1;
          local_3c = uVar3;
        }
        else {
LAB_00d51d59:
          p = (byte *)GetVarint32PtrFallback((char *)pbVar5,(char *)limit,&local_3c);
          pbVar5 = p;
        }
        if (pbVar5 == (byte *)0x0) goto LAB_00d51dcc;
        if (pbVar5 < limit) {
          bVar1 = *pbVar5;
          if (-1 < (char)bVar1) {
            p = pbVar5 + 1;
            local_40 = (int)(char)bVar1;
          }
          if ((char)bVar1 < '\0') goto LAB_00d51d86;
        }
        else {
LAB_00d51d86:
          p = (byte *)GetVarint32PtrFallback((char *)pbVar5,(char *)limit,&local_40);
        }
        if (p == (byte *)0x0) goto LAB_00d51dcc;
        if (p < limit) {
          bVar1 = *p;
          if (-1 < (char)bVar1) {
            pbVar5 = p + 1;
            local_44 = (int)(char)bVar1;
          }
          if ((char)bVar1 < '\0') goto LAB_00d51db0;
        }
        else {
LAB_00d51db0:
          pbVar5 = (byte *)GetVarint32PtrFallback((char *)p,(char *)limit,&local_44);
        }
        if (pbVar5 == (byte *)0x0) goto LAB_00d51dcc;
      }
      if ((uint)((int)limit - (int)pbVar5) < local_44 + local_40) goto LAB_00d51dcc;
    }
    bVar8 = local_3c == 0;
    if (bVar8 && pbVar5 != (byte *)0x0) {
      local_50 = (ulong)local_40;
      local_58 = pbVar5;
      iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_58,target);
      uVar3 = uVar6 - 1;
      if (iVar4 < 0) {
        index = uVar6;
        uVar3 = uVar7;
      }
    }
    else {
      CorruptionError(this);
      uVar3 = uVar7;
    }
    uVar7 = uVar3;
  } while (bVar8 && pbVar5 != (byte *)0x0);
  goto LAB_00d51e65;
  while( true ) {
    local_58 = (byte *)(this->key_)._M_dataplus._M_p;
    local_50 = (this->key_)._M_string_length;
    iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_58,target);
    if (-1 < iVar4) break;
LAB_00d51e34:
    bVar8 = ParseNextKey(this);
    if (!bVar8) break;
  }
LAB_00d51e65:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Seek(const Slice& target) override {
    // Binary search in restart array to find the last restart point
    // with a key < target
    uint32_t left = 0;
    uint32_t right = num_restarts_ - 1;
    while (left < right) {
      uint32_t mid = (left + right + 1) / 2;
      uint32_t region_offset = GetRestartPoint(mid);
      uint32_t shared, non_shared, value_length;
      const char* key_ptr =
          DecodeEntry(data_ + region_offset, data_ + restarts_, &shared,
                      &non_shared, &value_length);
      if (key_ptr == nullptr || (shared != 0)) {
        CorruptionError();
        return;
      }
      Slice mid_key(key_ptr, non_shared);
      if (Compare(mid_key, target) < 0) {
        // Key at "mid" is smaller than "target".  Therefore all
        // blocks before "mid" are uninteresting.
        left = mid;
      } else {
        // Key at "mid" is >= "target".  Therefore all blocks at or
        // after "mid" are uninteresting.
        right = mid - 1;
      }
    }

    // Linear search (within restart block) for first key >= target
    SeekToRestartPoint(left);
    while (true) {
      if (!ParseNextKey()) {
        return;
      }
      if (Compare(key_, target) >= 0) {
        return;
      }
    }
  }